

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

void __thiscall
Am_Value_List_Data::Add(Am_Value_List_Data *this,Am_Value *value,Am_Add_Position position)

{
  Am_List_Item *this_00;
  Am_List_Item *item;
  Am_Add_Position position_local;
  Am_Value *value_local;
  Am_Value_List_Data *this_local;
  
  *(short *)&(this->super_Am_Wrapper).field_0xc = *(short *)&(this->super_Am_Wrapper).field_0xc + 1;
  this_00 = (Am_List_Item *)operator_new(0x20);
  Am_List_Item::Am_List_Item(this_00);
  Am_List_Item::operator=(this_00,value);
  if (position == Am_HEAD) {
    if (this->head == (Am_List_Item *)0x0) {
      this->tail = this_00;
    }
    else {
      this->head->prev = this_00;
    }
    this_00->prev = (Am_List_Item *)0x0;
    this_00->next = this->head;
    this->head = this_00;
  }
  else {
    if (this->tail == (Am_List_Item *)0x0) {
      this->head = this_00;
    }
    else {
      this->tail->next = this_00;
    }
    this_00->next = (Am_List_Item *)0x0;
    this_00->prev = this->tail;
    this->tail = this_00;
  }
  return;
}

Assistant:

void
Am_Value_List_Data::Add(const Am_Value &value, Am_Add_Position position)
{
  ++number;
  Am_List_Item *item = new Am_List_Item;
  *item = value;
  if (position == Am_HEAD) {
    if (head)
      head->prev = item;
    else
      tail = item;
    item->prev = nullptr;
    item->next = head;
    head = item;
  } else {
    if (tail)
      tail->next = item;
    else
      head = item;
    item->next = nullptr;
    item->prev = tail;
    tail = item;
  }
}